

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.cpp
# Opt level: O1

void Imath_3_2::jacobiEigenSolver<float>
               (Matrix33<float> *A,Vec3<float> *S,Matrix33<float> *V,float tol)

{
  long lVar1;
  undefined8 uVar2;
  long lVar3;
  ulong uVar4;
  float *pfVar5;
  uint uVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float local_d8 [4];
  undefined1 local_c8 [16];
  float local_ac;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  auVar8._0_12_ = ZEXT812(0x3f800000);
  auVar8._12_4_ = 0;
  *(undefined1 (*) [16])V->x = auVar8;
  *(undefined1 (*) [16])(V->x[1] + 1) = auVar8;
  V->x[2][2] = 1.0;
  lVar3 = 0;
  do {
    *(float *)((long)&S->x + lVar3) = A->x[0][lVar3];
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0xc);
  fVar9 = 0.0;
  uVar4 = 0;
  pfVar5 = (float *)A;
  do {
    if (uVar4 < 2) {
      lVar3 = 1;
      fVar10 = fVar9;
      do {
        fVar9 = ABS(pfVar5[lVar3]);
        if (ABS(pfVar5[lVar3]) <= fVar10) {
          fVar9 = fVar10;
        }
        lVar1 = uVar4 + lVar3;
        lVar3 = lVar3 + 1;
        fVar10 = fVar9;
      } while (lVar1 != 2);
    }
    uVar4 = uVar4 + 1;
    pfVar5 = pfVar5 + 4;
  } while (uVar4 != 3);
  fVar9 = fVar9 * tol;
  if ((fVar9 != 0.0) || (NAN(fVar9))) {
    local_68 = ZEXT416((uint)fVar9);
    uVar6 = 0;
    while( true ) {
      local_d8[0] = 0.0;
      local_d8[1] = 0.0;
      local_d8[2] = 0.0;
      fVar9 = A->x[0][1];
      local_c8._0_4_ = A->x[1][1] - A->x[0][0];
      fVar10 = ABS(fVar9 + fVar9);
      fVar11 = ABS((float)local_c8._0_4_) * tol;
      local_48 = ZEXT416((uint)fVar10);
      local_58 = ZEXT416((uint)fVar11);
      if (fVar10 <= fVar11) {
        A->x[0][1] = 0.0;
      }
      else {
        local_c8._0_4_ = (float)local_c8._0_4_ / (fVar9 + fVar9);
        bVar7 = (float)local_c8._0_4_ < 0.0;
        fVar10 = (float)local_c8._0_4_ * (float)local_c8._0_4_ + 1.0;
        local_98._0_4_ = fVar9;
        if (fVar10 < 0.0) {
          local_c8 = ZEXT416((uint)local_c8._0_4_);
          fVar10 = sqrtf(fVar10);
        }
        else {
          fVar10 = SQRT(fVar10);
        }
        local_c8._0_4_ =
             *(float *)(&DAT_0014b120 + (ulong)bVar7 * 4) / (ABS((float)local_c8._0_4_) + fVar10);
        fVar9 = (float)local_c8._0_4_ * (float)local_c8._0_4_ + 1.0;
        if (fVar9 < 0.0) {
          local_c8 = ZEXT416((uint)local_c8._0_4_);
          fVar9 = sqrtf(fVar9);
        }
        else {
          fVar9 = SQRT(fVar9);
        }
        local_98._0_4_ = (float)local_98._0_4_ * (float)local_c8._0_4_;
        local_c8._0_4_ = (float)local_c8._0_4_ * (1.0 / fVar9);
        local_d8[1] = (float)local_98._0_4_ + 0.0;
        local_d8[0] = 0.0 - (float)local_98._0_4_;
        fVar10 = A->x[0][2];
        A->x[0][0] = A->x[0][0] - (float)local_98._0_4_;
        fVar11 = (float)local_c8._0_4_ / (1.0 / fVar9 + 1.0);
        A->x[1][1] = (float)local_98._0_4_ + A->x[1][1];
        A->x[0][1] = 0.0;
        fVar9 = A->x[1][2];
        A->x[0][2] = fVar10 - (fVar11 * fVar10 + fVar9) * (float)local_c8._0_4_;
        A->x[1][2] = (fVar10 - fVar11 * fVar9) * (float)local_c8._0_4_ + fVar9;
        lVar3 = 0;
        do {
          uVar2 = *(undefined8 *)((long)V->x[0] + lVar3);
          fVar9 = (float)uVar2;
          fVar10 = (float)((ulong)uVar2 >> 0x20);
          *(ulong *)((long)V->x[0] + lVar3) =
               CONCAT44((-fVar11 * fVar10 + fVar9) * (float)local_c8._0_4_ + fVar10,
                        (fVar11 * fVar9 + fVar10) * -(float)local_c8._0_4_ + fVar9);
          lVar3 = lVar3 + 0xc;
        } while (lVar3 != 0x24);
      }
      fVar9 = A->x[0][2];
      fVar13 = A->x[2][2] - A->x[0][0];
      fVar11 = ABS(fVar9 + fVar9);
      fVar10 = ABS(fVar13) * tol;
      local_98 = ZEXT416((uint)fVar11);
      local_c8 = ZEXT416((uint)fVar10);
      if (fVar11 <= fVar10) {
        A->x[0][2] = 0.0;
      }
      else {
        fVar13 = fVar13 / (fVar9 + fVar9);
        fVar10 = fVar13 * fVar13 + 1.0;
        local_88._0_4_ = fVar9;
        if (fVar10 < 0.0) {
          local_a8 = ZEXT416((uint)fVar13);
          fVar10 = sqrtf(fVar10);
          fVar9 = (float)local_a8._0_4_;
        }
        else {
          fVar10 = SQRT(fVar10);
          fVar9 = fVar13;
        }
        fVar9 = *(float *)(&DAT_0014b120 + (ulong)(fVar13 < 0.0) * 4) / (ABS(fVar9) + fVar10);
        fVar10 = fVar9 * fVar9 + 1.0;
        if (fVar10 < 0.0) {
          local_a8 = ZEXT416((uint)fVar9);
          fVar10 = sqrtf(fVar10);
          fVar9 = (float)local_a8._0_4_;
        }
        else {
          fVar10 = SQRT(fVar10);
        }
        fVar11 = (float)local_88._0_4_ * fVar9;
        fVar9 = fVar9 * (1.0 / fVar10);
        fVar13 = fVar9 / (1.0 / fVar10 + 1.0);
        local_d8[0] = local_d8[0] - fVar11;
        local_d8[2] = fVar11 + 0.0;
        fVar10 = A->x[0][1];
        A->x[0][0] = A->x[0][0] - fVar11;
        A->x[2][2] = fVar11 + A->x[2][2];
        A->x[0][2] = 0.0;
        fVar11 = A->x[1][2];
        A->x[0][1] = fVar10 - (fVar13 * fVar10 + fVar11) * fVar9;
        A->x[1][2] = (fVar10 - fVar13 * fVar11) * fVar9 + fVar11;
        lVar3 = 8;
        do {
          fVar10 = *(float *)((long)(V->x + -1) + 4 + lVar3);
          fVar11 = *(float *)((long)V->x[0] + lVar3);
          *(float *)((long)(V->x + -1) + 4 + lVar3) = (fVar13 * fVar10 + fVar11) * -fVar9 + fVar10;
          *(float *)((long)V->x[0] + lVar3) = (-fVar13 * fVar11 + fVar10) * fVar9 + fVar11;
          lVar3 = lVar3 + 0xc;
          fVar10 = (float)local_c8._0_4_;
        } while (lVar3 != 0x2c);
      }
      fVar9 = A->x[1][2];
      fVar12 = A->x[2][2] - A->x[1][1];
      fVar11 = ABS(fVar9 + fVar9);
      fVar13 = ABS(fVar12) * tol;
      if (fVar11 <= fVar13) {
        A->x[1][2] = 0.0;
      }
      else {
        fVar12 = fVar12 / (fVar9 + fVar9);
        fVar10 = fVar12 * fVar12 + 1.0;
        local_88 = ZEXT416((uint)fVar11);
        local_a8 = ZEXT416((uint)fVar13);
        local_ac = fVar9;
        if (fVar10 < 0.0) {
          local_78 = ZEXT416((uint)fVar12);
          fVar10 = sqrtf(fVar10);
          fVar9 = (float)local_78._0_4_;
        }
        else {
          fVar10 = SQRT(fVar10);
          fVar9 = fVar12;
        }
        fVar9 = *(float *)(&DAT_0014b120 + (ulong)(fVar12 < 0.0) * 4) / (ABS(fVar9) + fVar10);
        fVar10 = fVar9 * fVar9 + 1.0;
        if (fVar10 < 0.0) {
          local_78 = ZEXT416((uint)fVar9);
          fVar10 = sqrtf(fVar10);
          fVar9 = (float)local_78._0_4_;
        }
        else {
          fVar10 = SQRT(fVar10);
        }
        fVar11 = local_ac * fVar9;
        fVar9 = fVar9 * (1.0 / fVar10);
        fVar12 = fVar9 / (1.0 / fVar10 + 1.0);
        local_d8[1] = local_d8[1] - fVar11;
        local_d8[2] = local_d8[2] + fVar11;
        A->x[1][1] = A->x[1][1] - fVar11;
        A->x[2][2] = fVar11 + A->x[2][2];
        A->x[1][2] = 0.0;
        uVar2 = *(undefined8 *)(A->x[0] + 1);
        fVar10 = (float)uVar2;
        fVar11 = (float)((ulong)uVar2 >> 0x20);
        *(ulong *)(A->x[0] + 1) =
             CONCAT44((-fVar12 * fVar11 + fVar10) * fVar9 + fVar11,
                      (fVar12 * fVar10 + fVar11) * -fVar9 + fVar10);
        lVar3 = 4;
        do {
          uVar2 = *(undefined8 *)((long)V->x[0] + lVar3);
          fVar10 = (float)uVar2;
          fVar11 = (float)((ulong)uVar2 >> 0x20);
          *(ulong *)((long)V->x[0] + lVar3) =
               CONCAT44((-fVar12 * fVar11 + fVar10) * fVar9 + fVar11,
                        (fVar12 * fVar10 + fVar11) * -fVar9 + fVar10);
          lVar3 = lVar3 + 0xc;
          fVar10 = (float)local_c8._0_4_;
          fVar11 = (float)local_88._0_4_;
          fVar13 = (float)local_a8._0_4_;
        } while (lVar3 != 0x28);
      }
      lVar3 = 0;
      do {
        fVar9 = *(float *)((long)local_d8 + lVar3) + *(float *)((long)&S->x + lVar3);
        *(float *)((long)&S->x + lVar3) = fVar9;
        A->x[0][lVar3] = fVar9;
        lVar3 = lVar3 + 4;
      } while (lVar3 != 0xc);
      if ((bool)(~((float)local_58._0_4_ < (float)local_48._0_4_ || fVar10 < (float)local_98._0_4_)
                & fVar11 <= fVar13)) break;
      fVar9 = 0.0;
      uVar4 = 0;
      pfVar5 = (float *)A;
      do {
        if (uVar4 < 2) {
          lVar3 = 1;
          do {
            fVar10 = ABS(pfVar5[lVar3]);
            if (ABS(pfVar5[lVar3]) <= fVar9) {
              fVar10 = fVar9;
            }
            fVar9 = fVar10;
            lVar1 = uVar4 + lVar3;
            lVar3 = lVar3 + 1;
          } while (lVar1 != 2);
        }
        uVar4 = uVar4 + 1;
        pfVar5 = pfVar5 + 4;
      } while (uVar4 != 3);
      if (fVar9 <= (float)local_68._0_4_) {
        return;
      }
      bVar7 = 0x12 < uVar6;
      uVar6 = uVar6 + 1;
      if (bVar7) {
        return;
      }
    }
  }
  return;
}

Assistant:

void
jacobiEigenSolver (Matrix33<T>& A, Vec3<T>& S, Matrix33<T>& V, const T tol)
{
    V.makeIdentity ();
    for (int i = 0; i < 3; ++i)
    {
        S[i] = A[i][i];
    }

    const int maxIter =
        20; // In case we get really unlucky, prevents infinite loops
    const T absTol =
        tol * maxOffDiagSymm (A); // Tolerance is in terms of the maximum
    if (absTol != 0)              // _off-diagonal_ entry.
    {
        int numIter = 0;
        do
        {
            // Z is for accumulating small changes (h) to diagonal entries
            // of A for one sweep. Adding h's directly to A might cause
            // a cancellation effect when h is relatively very small to
            // the corresponding diagonal entry of A and
            // this will increase numerical errors
            Vec3<T> Z (0, 0, 0);
            ++numIter;
            bool changed = jacobiRotation<0, 1, 2> (A, V, Z, tol);
            changed      = jacobiRotation<0, 2, 1> (A, V, Z, tol) || changed;
            changed      = jacobiRotation<1, 2, 0> (A, V, Z, tol) || changed;
            // One sweep passed. Add accumulated changes (Z) to singular values (S)
            // Update diagonal elements of A for better accuracy as well.
            for (int i = 0; i < 3; ++i)
            {
                A[i][i] = S[i] += Z[i];
            }
            if (!changed) break;
        } while (maxOffDiagSymm (A) > absTol && numIter < maxIter);
    }
}